

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Text_Display.cxx
# Opt level: O3

void __thiscall
Fl_Text_Display::find_wrap_range
          (Fl_Text_Display *this,char *deletedText,int pos,int nInserted,int nDeleted,
          int *modRangeStart,int *modRangeEnd,int *linesInserted,int *linesDeleted)

{
  uint startPos;
  uint uVar1;
  int iVar2;
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  int *piVar7;
  Fl_Text_Buffer *pFVar8;
  int *piVar9;
  int iVar10;
  undefined4 in_register_00000084;
  ulong uVar11;
  ulong uVar12;
  int iVar13;
  int retLineEnd;
  int retPos;
  int *local_78;
  ulong local_70;
  undefined8 local_68;
  ulong local_60;
  int retLineStart;
  int *local_50;
  ulong local_48;
  char *local_40;
  int retLines;
  
  local_68 = CONCAT44(in_register_00000084,nDeleted);
  pFVar8 = this->mBuffer;
  uVar5 = this->mNVisibleLines;
  uVar6 = (ulong)uVar5;
  local_50 = this->mLineStarts;
  local_40 = deletedText;
  if ((pos < this->mFirstChar) || (this->mLastChar < pos)) {
LAB_001d3def:
    startPos = Fl_Text_Buffer::line_start(pFVar8,pos);
    uVar11 = 0;
  }
  else {
    piVar9 = local_50 + uVar6;
    uVar11 = uVar6;
    do {
      piVar9 = piVar9 + -1;
      iVar10 = (int)uVar11;
      if (iVar10 < 2) goto LAB_001d3def;
      uVar11 = (ulong)(iVar10 - 1);
    } while (pos < *piVar9 || *piVar9 == -1);
    uVar11 = (ulong)(iVar10 - 2);
    startPos = local_50[uVar11];
  }
  *modRangeStart = startPos;
  uVar1 = pos + nInserted;
  iVar10 = 0;
  piVar9 = &retLines;
  local_70 = (ulong)startPos;
  local_78 = modRangeStart;
  local_60 = (ulong)(uint)pos;
  local_48 = (ulong)(uint)nInserted;
  do {
    wrapped_line_counter
              (this,pFVar8,startPos,pFVar8->mLength,1,true,0,&retPos,piVar9,&retLineStart,
               &retLineEnd,true);
    startPos = retPos;
    iVar2 = pFVar8->mLength;
    if (iVar2 <= retPos) {
      *modRangeEnd = iVar2;
      iVar10 = iVar10 + (uint)(retPos != retLineEnd);
      goto LAB_001d3fe0;
    }
    iVar10 = iVar10 + 1;
    if ((int)uVar1 < retPos) {
      iVar2 = Fl_Text_Buffer::prev_char(pFVar8,retPos);
      uVar3 = Fl_Text_Buffer::char_at(pFVar8,iVar2);
      if (uVar3 == 10) {
        *modRangeEnd = startPos;
        iVar2 = startPos;
LAB_001d3fe0:
        uVar6 = local_70;
        *linesInserted = iVar10;
        if (this->mSuppressResync == 0) {
          uVar5 = (int)local_60 - (int)local_70;
          local_78 = (int *)(ulong)uVar5;
          iVar10 = (iVar2 - uVar1) + uVar5 + (int)local_68;
          pFVar8 = (Fl_Text_Buffer *)operator_new(0x88);
          Fl_Text_Buffer::Fl_Text_Buffer(pFVar8,iVar10,0x400);
          Fl_Text_Buffer::copy
                    (pFVar8,(EVP_PKEY_CTX *)this->mBuffer,(EVP_PKEY_CTX *)(uVar6 & 0xffffffff));
          if ((int)local_68 != 0) {
            Fl_Text_Buffer::insert(pFVar8,(int)local_78,local_40);
          }
          Fl_Text_Buffer::copy(pFVar8,(EVP_PKEY_CTX *)this->mBuffer,(EVP_PKEY_CTX *)(ulong)uVar1);
          wrapped_line_counter
                    (this,pFVar8,0,iVar10,0x7fffffff,true,(int)local_70,&retPos,piVar9,&retLineStart
                     ,&retLineEnd,false);
          Fl_Text_Buffer::~Fl_Text_Buffer(pFVar8);
          operator_delete(pFVar8,0x88);
        }
        else {
          piVar9 = &this->mNLinesDeleted;
        }
        *linesDeleted = *piVar9;
        this->mSuppressResync = 0;
        return;
      }
    }
    if (this->mSuppressResync == 0) {
      iVar2 = (int)uVar11;
      if ((int)local_60 < (int)startPos) {
        if (((int)uVar1 < (int)startPos) && (iVar2 < (int)uVar5)) {
          iVar4 = (startPos - (int)local_48) + (int)local_68;
          piVar7 = local_50 + iVar2;
          uVar12 = uVar11;
          do {
            iVar2 = *piVar7;
            if (iVar4 <= iVar2) {
              uVar11 = uVar12;
              if (iVar2 == iVar4 && iVar2 != -1) {
                iVar2 = line_end(this,startPos,true);
                *modRangeEnd = startPos;
                goto LAB_001d3fe0;
              }
              break;
            }
            uVar3 = (int)uVar12 + 1;
            uVar12 = (ulong)uVar3;
            piVar7 = piVar7 + 1;
            uVar11 = uVar6;
          } while (uVar5 != uVar3);
        }
      }
      else {
        uVar12 = uVar11;
        if (iVar2 < (int)uVar5) {
          piVar7 = local_50 + iVar2;
          do {
            if ((int)startPos <= *piVar7) {
              uVar12 = uVar11;
              if (*piVar7 == startPos) {
                iVar4 = (int)uVar11 + 1;
                iVar10 = 0;
                iVar2 = startPos;
                if (iVar4 < (int)uVar5) {
                  iVar4 = local_50[iVar4];
                  iVar10 = 0;
                  local_70 = (ulong)startPos;
                  iVar13 = (int)local_60;
                  if (iVar4 == -1) goto LAB_001d3f83;
                  goto LAB_001d3f6f;
                }
                local_70 = (ulong)startPos;
                goto LAB_001d3f83;
              }
              break;
            }
            uVar3 = (int)uVar11 + 1;
            uVar11 = (ulong)uVar3;
            piVar7 = piVar7 + 1;
            uVar12 = uVar6;
          } while (uVar5 != uVar3);
        }
        uVar11 = uVar12;
        iVar4 = startPos;
        iVar13 = *local_78;
LAB_001d3f6f:
        iVar2 = Fl_Text_Buffer::prev_char(pFVar8,iVar4);
        if (iVar13 < iVar2) {
          iVar2 = iVar13;
        }
LAB_001d3f83:
        *local_78 = iVar2;
      }
    }
  } while( true );
}

Assistant:

void Fl_Text_Display::find_wrap_range(const char *deletedText, int pos,
                                      int nInserted, int nDeleted,
                                      int *modRangeStart, int *modRangeEnd,
                                      int *linesInserted, int *linesDeleted) {
  IS_UTF8_ALIGNED(deletedText)
  IS_UTF8_ALIGNED2(buffer(), pos)

  int length, retPos, retLines, retLineStart, retLineEnd;
  Fl_Text_Buffer *deletedTextBuf, *buf = buffer();
  int nVisLines = mNVisibleLines;
  int *lineStarts = mLineStarts;
  int countFrom, countTo, lineStart, adjLineStart, i;
  int visLineNum = 0, nLines = 0;

  /*
   ** Determine where to begin searching: either the previous newline, or
   ** if possible, limit to the start of the (original) previous displayed
   ** line, using information from the existing line starts array
   */
  if (pos >= mFirstChar && pos <= mLastChar) {
    for (i=nVisLines-1; i>0; i--) {
      if (lineStarts[i] != -1 && pos >= lineStarts[i]) {
        break;
      }
    }
    if (i > 0) {
      countFrom = lineStarts[i-1];
      visLineNum = i-1;
    } else {
      countFrom = buf->line_start(pos);
    }
  } else {
    countFrom = buf->line_start(pos);
  }

  IS_UTF8_ALIGNED2(buf, countFrom)

  /*
   ** Move forward through the (new) text one line at a time, counting
   ** displayed lines, and looking for either a real newline, or for the
   ** line starts to re-sync with the original line starts array
   */
  lineStart = countFrom;
  *modRangeStart = countFrom;
  for (;;) {

    /* advance to the next line.  If the line ended in a real newline
     or the end of the buffer, that's far enough */
    wrapped_line_counter(buf, lineStart, buf->length(), 1, true, 0,
                         &retPos, &retLines, &retLineStart, &retLineEnd);
    if (retPos >= buf->length()) {
      countTo = buf->length();
      *modRangeEnd = countTo;
      if (retPos != retLineEnd)
        nLines++;
      break;
    } else {
      lineStart = retPos;
    }
    nLines++;
    if (lineStart > pos + nInserted && buf->char_at(buf->prev_char(lineStart)) == '\n') {
      countTo = lineStart;
      *modRangeEnd = lineStart;
      break;
    }

    /* Don't try to resync in continuous wrap mode with non-fixed font
     sizes; it would result in a chicken-and-egg dependency between
     the calculations for the inserted and the deleted lines.
     If we're in that mode, the number of deleted lines is calculated in
     advance, without resynchronization, so we shouldn't resynchronize
     for the inserted lines either. */
    if (mSuppressResync)
      continue;

    /* check for synchronization with the original line starts array
     before pos, if so, the modified range can begin later */
    if (lineStart <= pos) {
      while (visLineNum<nVisLines && lineStarts[visLineNum] < lineStart)
        visLineNum++;
      if (visLineNum < nVisLines && lineStarts[visLineNum] == lineStart) {
        countFrom = lineStart;
        nLines = 0;
        if (visLineNum+1 < nVisLines && lineStarts[visLineNum+1] != -1)
          *modRangeStart = min(pos, buf->prev_char(lineStarts[visLineNum+1]));
        else
          *modRangeStart = countFrom;
      } else
        *modRangeStart = min(*modRangeStart, buf->prev_char(lineStart));
    }

    /* check for synchronization with the original line starts array
     after pos, if so, the modified range can end early */
    else if (lineStart > pos + nInserted) {
      adjLineStart = lineStart - nInserted + nDeleted;
      while (visLineNum<nVisLines && lineStarts[visLineNum]<adjLineStart)
        visLineNum++;
      if (visLineNum < nVisLines && lineStarts[visLineNum] != -1 &&
          lineStarts[visLineNum] == adjLineStart) {
        countTo = line_end(lineStart, true);
        *modRangeEnd = lineStart;
        break;
      }
    }
  }
  *linesInserted = nLines;


  /* Count deleted lines between countFrom and countTo as the text existed
   before the modification (that is, as if the text between pos and
   pos+nInserted were replaced by "deletedText").  This extra context is
   necessary because wrapping can occur outside of the modified region
   as a result of adding or deleting text in the region. This is done by
   creating a textBuffer containing the deleted text and the necessary
   additional context, and calling the wrappedLineCounter on it.

   NOTE: This must not be done in continuous wrap mode when the font
   width is not fixed. In that case, the calculation would try
   to access style information that is no longer available (deleted
   text), or out of date (updated highlighting), possibly leading
   to completely wrong calculations and/or even crashes eventually.
   (This is not theoretical; it really happened.)

   In that case, the calculation of the number of deleted lines
   has happened before the buffer was modified (only in that case,
   because resynchronization of the line starts is impossible
   in that case, which makes the whole calculation less efficient).
   */
  if (mSuppressResync) {
    *linesDeleted = mNLinesDeleted;
    mSuppressResync = 0;
    return;
  }

  length = (pos-countFrom) + nDeleted +(countTo-(pos+nInserted));
  deletedTextBuf = new Fl_Text_Buffer(length);
  deletedTextBuf->copy(buffer(), countFrom, pos, 0);
  if (nDeleted != 0)
    deletedTextBuf->insert(pos-countFrom, deletedText);
  deletedTextBuf->copy(buffer(), pos+nInserted, countTo, pos-countFrom+nDeleted);
  /* Note that we need to take into account an offset for the style buffer:
   the deletedTextBuf can be out of sync with the style buffer. */
  wrapped_line_counter(deletedTextBuf, 0, length, INT_MAX, true, countFrom,
                       &retPos, &retLines, &retLineStart, &retLineEnd, false);
  delete deletedTextBuf;
  *linesDeleted = retLines;
  mSuppressResync = 0;
}